

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3.hpp
# Opt level: O1

ret_t trng::utility::u01xx_traits<double,_1UL,_trng::yarn3>::addin(yarn3 *r)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar1 = (r->S).r[0];
  iVar2 = (r->S).r[1];
  uVar6 = (long)(r->S).r[2] * (long)(r->P).a[2] +
          (long)(r->P).a[1] * (long)iVar2 + (long)(r->P).a[0] * (long)iVar1;
  uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
  uVar6 = uVar7 - 0xfffffffe;
  if (uVar7 < 0xfffffffe) {
    uVar6 = uVar7;
  }
  (r->S).r[2] = iVar2;
  (r->S).r[1] = iVar1;
  uVar3 = (uint)uVar6 + 0x80000001;
  if (uVar6 < 0x7fffffff) {
    uVar3 = (uint)uVar6;
  }
  (r->S).r[0] = uVar3;
  if (uVar3 != 0) {
    uVar4 = (uint)((ulong)*(uint *)(yarn3::g + (ulong)(uVar3 & 0xffff) * 4) *
                  (ulong)*(uint *)(yarn3::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000)) &
            0x7fffffff;
    iVar1 = (int)((ulong)*(uint *)(yarn3::g + (ulong)(uVar3 & 0xffff) * 4) *
                  (ulong)*(uint *)(yarn3::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000) >> 0x1f);
    uVar5 = uVar4 + iVar1;
    uVar3 = uVar4 + 0x80000001 + iVar1;
    if (uVar5 < 0x7fffffff) {
      uVar3 = uVar5;
    }
    return (double)(int)uVar3;
  }
  return 0.0;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3::step() {
    const uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
                     static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1]) +
                     static_cast<uint64_t>(P.a[2]) * static_cast<uint64_t>(S.r[2])};
    S.r[2] = S.r[1];
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 3>(t);
  }